

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

void ARKStepPrintMem(void *arkode_mem,FILE *outfile)

{
  int iVar1;
  FILE *in_RSI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ARKodeMem in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  FILE *local_10;
  
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (ARKodeARKStepMem *)0x112b089);
  if (iVar1 == 0) {
    local_10 = in_RSI;
    if (in_RSI == (FILE *)0x0) {
      local_10 = _stdout;
    }
    arkPrintMem(in_stack_ffffffffffffffe0,(FILE *)(ulong)in_stack_ffffffffffffffd8);
    fprintf(local_10,"ARKStep: q = %i\n",(ulong)(uint)in_stack_ffffffffffffffe0->Ratolmin0);
    fprintf(local_10,"ARKStep: p = %i\n",(ulong)(uint)in_stack_ffffffffffffffe0->user_efun);
    fprintf(local_10,"ARKStep: istage = %i\n",(ulong)*(uint *)&in_stack_ffffffffffffffe0->efun);
    fprintf(local_10,"ARKStep: stages = %i\n",
            (ulong)*(uint *)((long)&in_stack_ffffffffffffffe0->efun + 4));
    fprintf(local_10,"ARKStep: maxcor = %i\n",(ulong)*(uint *)&in_stack_ffffffffffffffe0->rwt);
    fprintf(local_10,"ARKStep: msbp = %i\n",(ulong)*(uint *)&in_stack_ffffffffffffffe0->step_mem);
    fprintf(local_10,"ARKStep: predictor = %i\n",
            (ulong)*(uint *)&in_stack_ffffffffffffffe0->step_getmassmem);
    fprintf(local_10,"ARKStep: lsolve_type = %i\n",
            (ulong)*(uint *)&in_stack_ffffffffffffffe0->tempv3);
    fprintf(local_10,"ARKStep: msolve_type = %i\n",
            (ulong)*(uint *)((long)&in_stack_ffffffffffffffe0->h + 4));
    fprintf(local_10,"ARKStep: convfail = %i\n",
            (ulong)*(uint *)((long)&in_stack_ffffffffffffffe0->rwt + 4));
    fprintf(local_10,"ARKStep: nfe = %li\n",in_stack_ffffffffffffffe0->hmin);
    fprintf(local_10,"ARKStep: nfi = %li\n",in_stack_ffffffffffffffe0->hmax_inv);
    fprintf(local_10,"ARKStep: nsetups = %li\n",in_stack_ffffffffffffffe0->hprime);
    fprintf(local_10,"ARKStep: nstlp = %li\n",in_stack_ffffffffffffffe0->ewt);
    fprintf(local_10,"ARKStep: user_linear = %i\n",
            (ulong)*(uint *)&in_stack_ffffffffffffffe0->user_data);
    fprintf(local_10,"ARKStep: user_linear_timedep = %i\n",
            (ulong)*(uint *)((long)&in_stack_ffffffffffffffe0->user_data + 4));
    fprintf(local_10,"ARKStep: user_explicit = %i\n",(ulong)(uint)in_stack_ffffffffffffffe0->itol);
    fprintf(local_10,"ARKStep: user_implicit = %i\n",(ulong)(uint)in_stack_ffffffffffffffe0->ritol);
    fprintf(local_10,"ARKStep: jcur = %i\n",(ulong)(uint)in_stack_ffffffffffffffe0->rwt_is_ewt);
    if (in_stack_ffffffffffffffe0->e_data != (void *)0x0) {
      fprintf(local_10,"ARKStep: explicit Butcher table:\n");
      ARKodeButcherTable_Write
                ((ARKodeButcherTable)in_stack_ffffffffffffffe0,
                 (FILE *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
    if (*(long *)&in_stack_ffffffffffffffe0->user_rfun != 0) {
      fprintf(local_10,"ARKStep: implicit Butcher table:\n");
      ARKodeButcherTable_Write
                ((ARKodeButcherTable)in_stack_ffffffffffffffe0,
                 (FILE *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
    fprintf(local_10,"ARKStep: gamma = %.16g\n",in_stack_ffffffffffffffe0->step_attachmasssol);
    fprintf(local_10,"ARKStep: gammap = %.16g\n",in_stack_ffffffffffffffe0->step_disablelsetup);
    fprintf(local_10,"ARKStep: gamrat = %.16g\n",in_stack_ffffffffffffffe0->step_disablemsetup);
    fprintf(local_10,"ARKStep: crate = %.16g\n",in_stack_ffffffffffffffe0->step_getgammas);
    fprintf(local_10,"ARKStep: eRNrm = %.16g\n",in_stack_ffffffffffffffe0->step_fullrhs);
    fprintf(local_10,"ARKStep: nlscoef = %.16g\n",in_stack_ffffffffffffffe0->step);
    fprintf(local_10,"ARKStep: crdown = %.16g\n",in_stack_ffffffffffffffe0->step_getimplicitrhs);
    fprintf(local_10,"ARKStep: rdiv = %.16g\n",in_stack_ffffffffffffffe0->step_mmult);
    fprintf(local_10,"ARKStep: dgmax = %.16g\n",in_stack_ffffffffffffffe0->step_getlinmem);
  }
  return;
}

Assistant:

void ARKStepPrintMem(void* arkode_mem, FILE* outfile)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  int i;
#endif

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepPrintMem",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return;

  /* if outfile==NULL, set it to stdout */
  if (outfile == NULL)  outfile = stdout;

  /* output data from main ARKode infrastructure */
  arkPrintMem(ark_mem, outfile);

  /* output integer quantities */
  fprintf(outfile,"ARKStep: q = %i\n", step_mem->q);
  fprintf(outfile,"ARKStep: p = %i\n", step_mem->p);
  fprintf(outfile,"ARKStep: istage = %i\n", step_mem->istage);
  fprintf(outfile,"ARKStep: stages = %i\n", step_mem->stages);
  fprintf(outfile,"ARKStep: maxcor = %i\n", step_mem->maxcor);
  fprintf(outfile,"ARKStep: msbp = %i\n", step_mem->msbp);
  fprintf(outfile,"ARKStep: predictor = %i\n", step_mem->predictor);
  fprintf(outfile,"ARKStep: lsolve_type = %i\n", step_mem->lsolve_type);
  fprintf(outfile,"ARKStep: msolve_type = %i\n", step_mem->msolve_type);
  fprintf(outfile,"ARKStep: convfail = %i\n", step_mem->convfail);

  /* output long integer quantities */
  fprintf(outfile,"ARKStep: nfe = %li\n", step_mem->nfe);
  fprintf(outfile,"ARKStep: nfi = %li\n", step_mem->nfi);
  fprintf(outfile,"ARKStep: nsetups = %li\n", step_mem->nsetups);
  fprintf(outfile,"ARKStep: nstlp = %li\n", step_mem->nstlp);

  /* output boolean quantities */
  fprintf(outfile,"ARKStep: user_linear = %i\n", step_mem->linear);
  fprintf(outfile,"ARKStep: user_linear_timedep = %i\n", step_mem->linear_timedep);
  fprintf(outfile,"ARKStep: user_explicit = %i\n", step_mem->explicit);
  fprintf(outfile,"ARKStep: user_implicit = %i\n", step_mem->implicit);
  fprintf(outfile,"ARKStep: jcur = %i\n", step_mem->jcur);

  /* output realtype quantities */
  if (step_mem->Be != NULL) {
    fprintf(outfile,"ARKStep: explicit Butcher table:\n");
    ARKodeButcherTable_Write(step_mem->Be, outfile);
  }
  if (step_mem->Bi != NULL) {
    fprintf(outfile,"ARKStep: implicit Butcher table:\n");
    ARKodeButcherTable_Write(step_mem->Bi, outfile);
  }
  fprintf(outfile,"ARKStep: gamma = %"RSYM"\n", step_mem->gamma);
  fprintf(outfile,"ARKStep: gammap = %"RSYM"\n", step_mem->gammap);
  fprintf(outfile,"ARKStep: gamrat = %"RSYM"\n", step_mem->gamrat);
  fprintf(outfile,"ARKStep: crate = %"RSYM"\n", step_mem->crate);
  fprintf(outfile,"ARKStep: eRNrm = %"RSYM"\n", step_mem->eRNrm);
  fprintf(outfile,"ARKStep: nlscoef = %"RSYM"\n", step_mem->nlscoef);
  fprintf(outfile,"ARKStep: crdown = %"RSYM"\n", step_mem->crdown);
  fprintf(outfile,"ARKStep: rdiv = %"RSYM"\n", step_mem->rdiv);
  fprintf(outfile,"ARKStep: dgmax = %"RSYM"\n", step_mem->dgmax);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  fprintf(outfile, "ARKStep: sdata:\n");
  N_VPrintFile(step_mem->sdata, outfile);
  fprintf(outfile, "ARKStep: zpred:\n");
  N_VPrintFile(step_mem->zpred, outfile);
  fprintf(outfile, "ARKStep: zcor:\n");
  N_VPrintFile(step_mem->zcor, outfile);
  if (step_mem->Fe != NULL)
    for (i=0; i<step_mem->stages; i++) {
      fprintf(outfile,"ARKStep: Fe[%i]:\n", i);
      N_VPrintFile(step_mem->Fe[i], outfile);
    }
  if (step_mem->Fi != NULL)
    for (i=0; i<step_mem->stages; i++) {
      fprintf(outfile,"ARKStep: Fi[%i]:\n", i);
      N_VPrintFile(step_mem->Fi[i], outfile);
    }
#endif
}